

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__write_hdr_scanline(FILE *f,int width,int comp,uchar *scratch,float *scanline)

{
  long lVar1;
  int len_1;
  int iVar2;
  ulong uVar3;
  uchar *puVar4;
  int len;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  undefined2 local_4c;
  ushort uStack_4a;
  uint uStack_48;
  uchar scanlineheader [4];
  float local_40;
  float local_3c;
  float linear [3];
  uchar rgbe [4];
  
  _local_4c = CONCAT22((ushort)width << 8 | (ushort)width >> 8,0x202);
  if (width - 0x8000U < 0xffff8008) {
    uVar3 = 0;
    if (0 < width) {
      uVar3 = (ulong)(uint)width;
    }
    _uStack_48 = (ulong)(comp - 3);
    while (bVar10 = uVar3 != 0, uVar3 = uVar3 - 1, bVar10) {
      if (comp - 1U < 2) {
        local_40 = *scanline;
        local_3c = local_40;
        linear[0] = local_40;
      }
      else if (uStack_48 < 2) {
        linear[0] = scanline[2];
        local_3c = scanline[1];
        local_40 = *scanline;
      }
      stbiw__linear_to_rgbe((uchar *)(linear + 1),&local_40);
      fwrite(linear + 1,4,1,(FILE *)f);
      scanline = scanline + comp;
    }
  }
  else {
    _uStack_48 = (ulong)(uint)width;
    for (uVar3 = 0; _uStack_48 != uVar3; uVar3 = uVar3 + 1) {
      if (comp - 1U < 2) {
        local_40 = *scanline;
        local_3c = local_40;
        linear[0] = local_40;
      }
      else if (comp - 3U < 2) {
        linear[0] = scanline[2];
        local_3c = scanline[1];
        local_40 = *scanline;
      }
      stbiw__linear_to_rgbe((uchar *)(linear + 1),&local_40);
      scratch[uVar3] = linear[1]._0_1_;
      scratch[uVar3 + (uint)width] = linear[1]._1_1_;
      scratch[uVar3 + (uint)(width * 2)] = linear[1]._2_1_;
      scratch[uVar3 + (uint)(width * 3)] = linear[1]._3_1_;
      scanline = scanline + comp;
    }
    fwrite(&local_4c,4,1,(FILE *)f);
    uVar3 = _uStack_48;
    puVar4 = scratch;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      lVar5 = lVar6 * uVar3;
      iVar2 = 0;
      while (iVar2 < width) {
        iVar7 = iVar2;
        for (lVar1 = (long)iVar2 + 2;
            (iVar8 = width, lVar1 < (long)uVar3 &&
            ((puVar4[lVar1 + -2] != puVar4[lVar1 + -1] ||
             (iVar8 = iVar7, puVar4[lVar1 + -2] != puVar4[lVar1])))); lVar1 = lVar1 + 1) {
          iVar7 = iVar7 + 1;
        }
        while( true ) {
          iVar7 = iVar8 - iVar2;
          if (iVar7 == 0 || iVar8 < iVar2) break;
          if (0x7f < iVar7) {
            iVar7 = 0x80;
          }
          stbiw__write_dump_data(f,iVar7,scratch + iVar2 + lVar5);
          iVar2 = iVar2 + iVar7;
        }
        uVar3 = _uStack_48;
        if (iVar8 + 2 < width) {
          for (uVar9 = (ulong)iVar8; (long)uVar9 < (long)_uStack_48; uVar9 = uVar9 + 1) {
            if (puVar4[uVar9] != scratch[iVar2 + lVar5]) goto LAB_00108302;
          }
          uVar9 = (ulong)(uint)width;
LAB_00108302:
          for (; iVar7 = (int)uVar9 - iVar2, uVar3 = _uStack_48, iVar7 != 0 && iVar2 <= (int)uVar9;
              iVar2 = iVar2 + iVar7) {
            if (0x7e < iVar7) {
              iVar7 = 0x7f;
            }
            stbiw__write_run_data(f,iVar7,scratch[iVar2 + lVar5]);
          }
        }
      }
      puVar4 = puVar4 + uVar3;
    }
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(FILE *f, int width, int comp, unsigned char *scratch, const float *scanline)
{
   unsigned char scanlineheader[4] = { 2, 2, 0, 0 };
   unsigned char rgbe[4];
   float linear[3];
   int x;

   scanlineheader[2] = (width&0xff00)>>8;
   scanlineheader[3] = (width&0x00ff);

   /* skip RLE for images too small or large */
   if (width < 8 || width >= 32768) {
      for (x=0; x < width; x++) {
         switch (comp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*comp + 2];
                    linear[1] = scanline[x*comp + 1];
                    linear[0] = scanline[x*comp + 0];
                    break;
            case 2: /* fallthrough */
            case 1: linear[0] = linear[1] = linear[2] = scanline[x*comp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         fwrite(rgbe, 4, 1, f);
      }
   } else {
      int c,r;
      /* encode into scratch buffer */
      for (x=0; x < width; x++) {
         switch(comp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*comp + 2];
                    linear[1] = scanline[x*comp + 1];
                    linear[0] = scanline[x*comp + 0];
                    break;
            case 2: /* fallthrough */
            case 1: linear[0] = linear[1] = linear[2] = scanline[x*comp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         scratch[x + width*0] = rgbe[0];
         scratch[x + width*1] = rgbe[1];
         scratch[x + width*2] = rgbe[2];
         scratch[x + width*3] = rgbe[3];
      }

      fwrite(scanlineheader, 4, 1, f);

      /* RLE each component separately */
      for (c=0; c < 4; c++) {
         unsigned char *comp = &scratch[width*c];

         x = 0;
         while (x < width) {
            // find first run
            r = x;
            while (r+2 < width) {
               if (comp[r] == comp[r+1] && comp[r] == comp[r+2])
                  break;
               ++r;
            }
            if (r+2 >= width)
               r = width;
            // dump up to first run
            while (x < r) {
               int len = r-x;
               if (len > 128) len = 128;
               stbiw__write_dump_data(f, len, &comp[x]);
               x += len;
            }
            // if there's a run, output it
            if (r+2 < width) { // same test as what we break out of in search loop, so only true if we break'd
               // find next byte after run
               while (r < width && comp[r] == comp[x])
                  ++r;
               // output run up to r
               while (x < r) {
                  int len = r-x;
                  if (len > 127) len = 127;
                  stbiw__write_run_data(f, len, comp[x]);
                  x += len;
               }
            }
         }
      }
   }
}